

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,bool once)

{
  xpath_ast_node *this_00;
  xml_attribute_struct *pxVar1;
  bool bVar2;
  long lVar3;
  xpath_node *pxVar4;
  ulong uVar5;
  xpath_node *it;
  xpath_node *pxVar6;
  size_t sVar7;
  double dVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  xpath_context c;
  xpath_context local_58;
  undefined1 extraout_var [56];
  
  auVar10 = in_ZMM1._0_16_;
  pxVar4 = ns->_begin;
  uVar5 = (long)ns->_end - (long)pxVar4 >> 4;
  if (uVar5 != first) {
    if ((this->_type & 0xfeU) != 0x10) {
      __assert_fail("_type == ast_filter || _type == ast_predicate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x262e,
                    "void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate(xpath_node_set_raw &, size_t, const xpath_stack &, bool)"
                   );
    }
    this_00 = this->_right;
    if ((this->_test & 0xfeU) == 2) {
      if (uVar5 < first) {
        __assert_fail("ns.size() >= first",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2610,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                     );
      }
      if (this_00->_rettype != '\x02') {
        __assert_fail("expr->rettype() == xpath_type_number",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2611,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                     );
      }
      pxVar4 = pxVar4 + first;
      local_58.n._node._root = (xml_node_struct *)0x0;
      local_58.n._attribute._attr = (xml_attribute_struct *)0x0;
      local_58.position = 1;
      local_58.size = uVar5 - first;
      auVar9._0_8_ = eval_number(this_00,&local_58,stack);
      auVar9._8_56_ = extraout_var;
      if ((1.0 <= auVar9._0_8_) &&
         (auVar10 = vcvtusi2sd_avx512f(auVar10,uVar5 - first), auVar9._0_8_ <= auVar10._0_8_)) {
        lVar3 = vcvttsd2usi_avx512f(auVar9._0_16_);
        auVar10 = vcvtusi2sd_avx512f(in_XMM2,lVar3);
        if ((auVar9._0_8_ == auVar10._0_8_) && (!NAN(auVar9._0_8_) && !NAN(auVar10._0_8_))) {
          pxVar1 = pxVar4[lVar3 + -1]._attribute._attr;
          (pxVar4->_node)._root = pxVar4[lVar3 + -1]._node._root;
          (pxVar4->_attribute)._attr = pxVar1;
          pxVar4 = pxVar4 + 1;
        }
      }
      if ((pxVar4 < ns->_begin) || (ns->_end < pxVar4)) goto LAB_001167c6;
      ns->_end = pxVar4;
    }
    else {
      if (this_00->_rettype == '\x02') {
        if (uVar5 < first) {
          __assert_fail("ns.size() >= first",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x25f6,
                        "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                       );
        }
        pxVar4 = pxVar4 + first;
        if (pxVar4 != ns->_end) {
          sVar7 = 1;
          pxVar6 = pxVar4;
          do {
            local_58.n._node._root = (pxVar6->_node)._root;
            local_58.n._attribute._attr = (pxVar6->_attribute)._attr;
            local_58.position = sVar7;
            local_58.size = uVar5 - first;
            dVar8 = eval_number(this_00,&local_58,stack);
            auVar10 = vcvtusi2sd_avx512f(in_XMM2,sVar7);
            if ((dVar8 != auVar10._0_8_) || (NAN(dVar8) || NAN(auVar10._0_8_))) {
              bVar2 = true;
            }
            else {
              pxVar1 = (pxVar6->_attribute)._attr;
              (pxVar4->_node)._root = (pxVar6->_node)._root;
              (pxVar4->_attribute)._attr = pxVar1;
              pxVar4 = pxVar4 + 1;
              bVar2 = !once;
            }
            if (!bVar2) break;
            pxVar6 = pxVar6 + 1;
            sVar7 = sVar7 + 1;
          } while (pxVar6 != ns->_end);
        }
      }
      else {
        if (uVar5 < first) {
          __assert_fail("ns.size() >= first",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x25dc,
                        "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_boolean(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                       );
        }
        pxVar4 = pxVar4 + first;
        if (pxVar4 != ns->_end) {
          sVar7 = 1;
          pxVar6 = pxVar4;
          do {
            local_58.n._node._root = (pxVar6->_node)._root;
            local_58.n._attribute._attr = (pxVar6->_attribute)._attr;
            local_58.position = sVar7;
            local_58.size = uVar5 - first;
            bVar2 = eval_boolean(this_00,&local_58,stack);
            if (bVar2) {
              pxVar1 = (pxVar6->_attribute)._attr;
              (pxVar4->_node)._root = (pxVar6->_node)._root;
              (pxVar4->_attribute)._attr = pxVar1;
              pxVar4 = pxVar4 + 1;
            }
            if (bVar2 && once) break;
            pxVar6 = pxVar6 + 1;
            sVar7 = sVar7 + 1;
          } while (pxVar6 != ns->_end);
        }
      }
      if ((pxVar4 < ns->_begin) || (ns->_end < pxVar4)) {
LAB_001167c6:
        __assert_fail("_begin <= pos && pos <= _end",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x22e6,
                      "void pugi::impl::(anonymous namespace)::xpath_node_set_raw::truncate(xpath_node *)"
                     );
      }
      ns->_end = pxVar4;
    }
  }
  return;
}

Assistant:

void apply_predicate(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, bool once)
		{
			if (ns.size() == first) return;

			assert(_type == ast_filter || _type == ast_predicate);

			if (_test == predicate_constant || _test == predicate_constant_one)
				apply_predicate_number_const(ns, first, _right, stack);
			else if (_right->rettype() == xpath_type_number)
				apply_predicate_number(ns, first, _right, stack, once);
			else
				apply_predicate_boolean(ns, first, _right, stack, once);
		}